

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O2

void Test_Template_Inheritence::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  TemplateString TVar10;
  TemplateString TVar11;
  TemplateString TVar12;
  TemplateString TVar13;
  TemplateString TVar14;
  TemplateString TVar15;
  TemplateString TVar16;
  Template *pTVar17;
  allocator local_3a1;
  TemplateDictionary incdict;
  string incname;
  TemplateString local_310;
  pointer local_2f0;
  size_type sStack_2e8;
  undefined1 local_2e0;
  uint7 uStack_2df;
  undefined8 uStack_2d8;
  TemplateDictionary dict2;
  TemplateString local_260;
  TemplateString local_240;
  TemplateString local_220;
  TemplateString local_200;
  TemplateString local_1e0;
  TemplateString local_1c0;
  TemplateString local_1a0;
  TemplateString local_180;
  TemplateString local_160;
  TemplateString local_140;
  TemplateString local_120;
  TemplateString local_100;
  TemplateString local_e0;
  TemplateString local_c0;
  TemplateString local_a0;
  TemplateDictionary dict;
  
  std::__cxx11::string::string
            ((string *)&dict,"{{FOO}}{{#SEC}}{{FOO}}{{#SEC}}{{FOO}}{{/SEC}}{{/SEC}}",
             (allocator *)&dict2);
  pTVar17 = ctemplate::StringToTemplate((string *)&dict,STRIP_WHITESPACE);
  std::__cxx11::string::~string((string *)&dict);
  ctemplate::TemplateString::TemplateString((TemplateString *)&dict2,"dict");
  ctemplate::TemplateDictionary::TemplateDictionary
            (&dict,(TemplateString *)&dict2,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_a0,"FOO");
  ctemplate::TemplateString::TemplateString(&local_c0,"foo");
  TVar1.length_ = local_a0.length_;
  TVar1.ptr_ = local_a0.ptr_;
  TVar1.is_immutable_ = local_a0.is_immutable_;
  TVar1._17_7_ = local_a0._17_7_;
  TVar1.id_ = local_a0.id_;
  TVar12.length_ = local_c0.length_;
  TVar12.ptr_ = local_c0.ptr_;
  TVar12.is_immutable_ = local_c0.is_immutable_;
  TVar12._17_7_ = local_c0._17_7_;
  TVar12.id_ = local_c0.id_;
  ctemplate::TemplateDictionary::SetValue(TVar1,TVar12);
  ctemplate::TemplateString::TemplateString(&local_e0,"SEC");
  TVar2.length_ = local_e0.length_;
  TVar2.ptr_ = local_e0.ptr_;
  TVar2.is_immutable_ = local_e0.is_immutable_;
  TVar2._17_7_ = local_e0._17_7_;
  TVar2.id_ = local_e0.id_;
  ctemplate::TemplateDictionary::ShowSection(TVar2);
  std::__cxx11::string::string((string *)&dict2,"foofoofoo",(allocator *)&incdict);
  ctemplate::AssertExpandIs(pTVar17,&dict,(string *)&dict2,true);
  std::__cxx11::string::~string((string *)&dict2);
  ctemplate::TemplateString::TemplateString((TemplateString *)&incdict,"dict2");
  ctemplate::TemplateDictionary::TemplateDictionary
            (&dict2,(TemplateString *)&incdict,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_100,"FOO");
  ctemplate::TemplateString::TemplateString(&local_120,"foo");
  TVar3.length_ = local_100.length_;
  TVar3.ptr_ = local_100.ptr_;
  TVar3.is_immutable_ = local_100.is_immutable_;
  TVar3._17_7_ = local_100._17_7_;
  TVar3.id_ = local_100.id_;
  TVar13.length_ = local_120.length_;
  TVar13.ptr_ = local_120.ptr_;
  TVar13.is_immutable_ = local_120.is_immutable_;
  TVar13._17_7_ = local_120._17_7_;
  TVar13.id_ = local_120.id_;
  ctemplate::TemplateDictionary::SetValue(TVar3,TVar13);
  ctemplate::TemplateString::TemplateString(&local_140,"SEC");
  TVar4.length_ = local_140.length_;
  TVar4.ptr_ = local_140.ptr_;
  TVar4.is_immutable_ = local_140.is_immutable_;
  TVar4._17_7_ = local_140._17_7_;
  TVar4.id_ = local_140.id_;
  ctemplate::TemplateDictionary::AddSectionDictionary(TVar4);
  std::__cxx11::string::string((string *)&incdict,"foofoofoo",(allocator *)&incname);
  ctemplate::AssertExpandIs(pTVar17,&dict2,(string *)&incdict,true);
  std::__cxx11::string::~string((string *)&incdict);
  ctemplate::TemplateString::TemplateString(&local_160,"FOO");
  ctemplate::TemplateString::TemplateString(&local_180,"bar");
  TVar5.length_ = local_160.length_;
  TVar5.ptr_ = local_160.ptr_;
  TVar5.is_immutable_ = local_160.is_immutable_;
  TVar5._17_7_ = local_160._17_7_;
  TVar5.id_ = local_160.id_;
  TVar14.length_ = local_180.length_;
  TVar14.ptr_ = local_180.ptr_;
  TVar14.is_immutable_ = local_180.is_immutable_;
  TVar14._17_7_ = local_180._17_7_;
  TVar14.id_ = local_180.id_;
  ctemplate::TemplateDictionary::SetValue(TVar5,TVar14);
  std::__cxx11::string::string((string *)&incdict,"foobarbar",(allocator *)&incname);
  ctemplate::AssertExpandIs(pTVar17,&dict2,(string *)&incdict,true);
  std::__cxx11::string::~string((string *)&incdict);
  ctemplate::TemplateString::TemplateString(&local_1a0,"SEC");
  TVar6.length_ = local_1a0.length_;
  TVar6.ptr_ = local_1a0.ptr_;
  TVar6.is_immutable_ = local_1a0.is_immutable_;
  TVar6._17_7_ = local_1a0._17_7_;
  TVar6.id_ = local_1a0.id_;
  ctemplate::TemplateDictionary::AddSectionDictionary(TVar6);
  std::__cxx11::string::string((string *)&incdict,"foobarbar",(allocator *)&incname);
  ctemplate::AssertExpandIs(pTVar17,&dict2,(string *)&incdict,true);
  std::__cxx11::string::~string((string *)&incdict);
  ctemplate::TemplateString::TemplateString(&local_1c0,"FOO");
  ctemplate::TemplateString::TemplateString(&local_1e0,"baz");
  TVar7.length_ = local_1c0.length_;
  TVar7.ptr_ = local_1c0.ptr_;
  TVar7.is_immutable_ = local_1c0.is_immutable_;
  TVar7._17_7_ = local_1c0._17_7_;
  TVar7.id_ = local_1c0.id_;
  TVar15.length_ = local_1e0.length_;
  TVar15.ptr_ = local_1e0.ptr_;
  TVar15.is_immutable_ = local_1e0.is_immutable_;
  TVar15._17_7_ = local_1e0._17_7_;
  TVar15.id_ = local_1e0.id_;
  ctemplate::TemplateDictionary::SetValue(TVar7,TVar15);
  std::__cxx11::string::string((string *)&incdict,"foobarbaz",(allocator *)&incname);
  ctemplate::AssertExpandIs(pTVar17,&dict2,(string *)&incdict,true);
  std::__cxx11::string::~string((string *)&incdict);
  std::__cxx11::string::string
            ((string *)&incdict,"{{FOO}}{{#SEC}}hi{{/SEC}}\n{{>INC}}",(allocator *)&incname);
  pTVar17 = ctemplate::StringToTemplate((string *)&incdict,STRIP_WHITESPACE);
  std::__cxx11::string::~string((string *)&incdict);
  std::__cxx11::string::string
            ((string *)&incdict,"include {{FOO}}{{#SEC}}invisible{{/SEC}}file\n",
             (allocator *)&local_310);
  ctemplate::StringToTemplateFile(&incname,(string *)&incdict);
  std::__cxx11::string::~string((string *)&incdict);
  ctemplate::TemplateString::TemplateString(&local_310,"dict");
  ctemplate::TemplateDictionary::TemplateDictionary(&incdict,&local_310,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_200,"SEC");
  TVar8.length_ = local_200.length_;
  TVar8.ptr_ = local_200.ptr_;
  TVar8.is_immutable_ = local_200.is_immutable_;
  TVar8._17_7_ = local_200._17_7_;
  TVar8.id_ = local_200.id_;
  ctemplate::TemplateDictionary::ShowSection(TVar8);
  ctemplate::TemplateString::TemplateString(&local_220,"FOO");
  ctemplate::TemplateString::TemplateString(&local_240,"foo");
  TVar9.length_ = local_220.length_;
  TVar9.ptr_ = local_220.ptr_;
  TVar9.is_immutable_ = local_220.is_immutable_;
  TVar9._17_7_ = local_220._17_7_;
  TVar9.id_ = local_220.id_;
  TVar16.length_ = local_240.length_;
  TVar16.ptr_ = local_240.ptr_;
  TVar16.is_immutable_ = local_240.is_immutable_;
  TVar16._17_7_ = local_240._17_7_;
  TVar16.id_ = local_240.id_;
  ctemplate::TemplateDictionary::SetValue(TVar9,TVar16);
  ctemplate::TemplateString::TemplateString(&local_260,"INC");
  TVar10.length_ = local_260.length_;
  TVar10.ptr_ = local_260.ptr_;
  TVar10.is_immutable_ = local_260.is_immutable_;
  TVar10._17_7_ = local_260._17_7_;
  TVar10.id_ = local_260.id_;
  ctemplate::TemplateDictionary::AddIncludeDictionary(TVar10);
  local_2f0 = incname._M_dataplus._M_p;
  sStack_2e8 = incname._M_string_length;
  local_2e0 = 0;
  uStack_2d8 = 0;
  TVar11.length_ = incname._M_string_length;
  TVar11.ptr_ = incname._M_dataplus._M_p;
  TVar11._16_8_ = (ulong)uStack_2df << 8;
  TVar11.id_ = 0;
  ctemplate::TemplateDictionary::SetFilename(TVar11);
  std::__cxx11::string::string((string *)&local_310,"foohiinclude file",&local_3a1);
  ctemplate::AssertExpandIs(pTVar17,&incdict,(string *)&local_310,true);
  std::__cxx11::string::~string((string *)&local_310);
  ctemplate::TemplateDictionary::~TemplateDictionary(&incdict);
  std::__cxx11::string::~string((string *)&incname);
  ctemplate::TemplateDictionary::~TemplateDictionary(&dict2);
  ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
  return;
}

Assistant:

TEST(Template, Inheritence) {
  Template* tpl = StringToTemplate("{{FOO}}{{#SEC}}{{FOO}}{{#SEC}}{{FOO}}{{/SEC}}{{/SEC}}",
                                   STRIP_WHITESPACE);
  TemplateDictionary dict("dict");
  dict.SetValue("FOO", "foo");
  dict.ShowSection("SEC");
  AssertExpandIs(tpl, &dict, "foofoofoo", true);

  TemplateDictionary dict2("dict2");
  dict2.SetValue("FOO", "foo");
  TemplateDictionary* sec = dict2.AddSectionDictionary("SEC");
  AssertExpandIs(tpl, &dict2, "foofoofoo", true);
  sec->SetValue("FOO", "bar");
  AssertExpandIs(tpl, &dict2, "foobarbar", true);
  TemplateDictionary* sec2 = sec->AddSectionDictionary("SEC");
  AssertExpandIs(tpl, &dict2, "foobarbar", true);
  sec2->SetValue("FOO", "baz");
  AssertExpandIs(tpl, &dict2, "foobarbaz", true);

  // Now test an include template, which shouldn't inherit from its parents
  tpl = StringToTemplate("{{FOO}}{{#SEC}}hi{{/SEC}}\n{{>INC}}",
                         STRIP_WHITESPACE);
  string incname = StringToTemplateFile(
      "include {{FOO}}{{#SEC}}invisible{{/SEC}}file\n");
  TemplateDictionary incdict("dict");
  incdict.ShowSection("SEC");
  incdict.SetValue("FOO", "foo");
  incdict.AddIncludeDictionary("INC")->SetFilename(incname);
  AssertExpandIs(tpl, &incdict, "foohiinclude file", true);
}